

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O2

string * __thiscall position::to_fen_abi_cxx11_(string *__return_storage_ptr__,position *this)

{
  char __lhs;
  Piece PVar1;
  Square SVar2;
  int iVar3;
  bool bVar4;
  ushort uVar5;
  Piece PVar6;
  int __val;
  char *__s;
  int c;
  long lVar7;
  ulong uVar8;
  int iVar9;
  allocator<char> local_e6;
  allocator<char> local_e5;
  int local_e4;
  string mv50;
  string half_mvs;
  string ep_sq;
  string c_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&c_str);
  iVar9 = 7;
  uVar8 = 0x38;
  while (-1 < iVar9) {
    __val = 0;
    local_e4 = iVar9;
    for (lVar7 = 0; iVar3 = local_e4, lVar7 != 8; lVar7 = lVar7 + 1) {
      if ((this->pcs).piece_on._M_elems[uVar8 + lVar7] == no_piece) {
        __val = __val + 1;
      }
      else {
        if (0 < __val) {
          std::__cxx11::to_string(&c_str,__val);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,&c_str);
          std::__cxx11::string::~string((string *)&c_str);
        }
        PVar1 = (this->pcs).piece_on._M_elems[uVar8 + lVar7];
        PVar6 = PVar1 + pieces;
        if ((this->pcs).color_on._M_elems[uVar8 + lVar7] != black) {
          PVar6 = PVar1;
        }
        __val = 0;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,
                   SanPiece.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)PVar6]);
      }
    }
    if (0 < __val) {
      std::__cxx11::to_string(&c_str,__val);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&c_str);
      std::__cxx11::string::~string((string *)&c_str);
    }
    iVar9 = iVar3 + -1;
    if (iVar3 != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"/");
    }
    uVar8 = (ulong)((int)uVar8 - 8);
  }
  __s = " b";
  if ((this->ifo).stm == white) {
    __s = " w";
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,__s);
  std::__cxx11::string::string<std::allocator<char>>((string *)&c_str,"",(allocator<char> *)&ep_sq);
  uVar5 = (this->ifo).cmask;
  if ((uVar5 & 1) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&c_str,"K");
    uVar5 = (this->ifo).cmask;
  }
  if ((uVar5 & 2) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&c_str,"Q");
    uVar5 = (this->ifo).cmask;
  }
  if ((uVar5 & 4) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&c_str,"k");
    uVar5 = (this->ifo).cmask;
  }
  if ((uVar5 & 8) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&c_str,"q");
  }
  bVar4 = std::operator==(&c_str,"");
  if (bVar4) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&ep_sq," -",&local_e5);
  }
  else {
    std::operator+(&ep_sq," ",&c_str);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,&ep_sq);
  std::__cxx11::string::~string((string *)&ep_sq);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ep_sq,"",(allocator<char> *)&mv50);
  SVar2 = (this->ifo).eps;
  if (SVar2 != no_square) {
    __lhs = SanCols.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start[SVar2 & H1];
    std::__cxx11::to_string(&half_mvs,((int)SVar2 >> 3) + 1);
    std::operator+(&mv50,__lhs,&half_mvs);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&ep_sq,&mv50);
    std::__cxx11::string::~string((string *)&mv50);
    std::__cxx11::string::~string((string *)&half_mvs);
  }
  bVar4 = std::operator==(&ep_sq,"");
  if (bVar4) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&mv50," -",&local_e6);
  }
  else {
    std::operator+(&mv50," ",&ep_sq);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,&mv50);
  std::__cxx11::string::~string((string *)&mv50);
  std::__cxx11::to_string(&mv50,(uint)(this->ifo).move50);
  std::operator+(&half_mvs," ",&mv50);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,&half_mvs);
  std::__cxx11::string::~string((string *)&half_mvs);
  std::__cxx11::to_string(&half_mvs,(uint)(this->ifo).hmvs);
  std::operator+(&local_50," ",&half_mvs);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&half_mvs);
  std::__cxx11::string::~string((string *)&mv50);
  std::__cxx11::string::~string((string *)&ep_sq);
  std::__cxx11::string::~string((string *)&c_str);
  return __return_storage_ptr__;
}

Assistant:

std::string position::to_fen() const {
	std::string fen = "";
	for (int r = 7; r >= 0; --r) {
		int empties = 0;

		for (int c = 0; c < 8; ++c) {
			int s = r * 8 + c;
			if (piece_on(Square(s)) == no_piece) { ++empties; continue; }
			if (empties > 0) fen += std::to_string(empties);
			empties = 0;

			fen += SanPiece[(color_on(Square(s)) == black ?
				piece_on(Square(s)) + 6 : piece_on(Square(s)))];
		}

		if (empties > 0) fen += std::to_string(empties);
		if (r > 0) fen += "/";
	}

	fen += (to_move() == white ? " w" : " b");

	// castle rights
	std::string c_str = "";
	if ((ifo.cmask & wks) == wks) c_str += "K";
	if ((ifo.cmask & wqs) == wqs) c_str += "Q";
	if ((ifo.cmask & bks) == bks) c_str += "k";
	if ((ifo.cmask & bqs) == bqs) c_str += "q";
	fen += (c_str == "" ? " -" : " " + c_str);

	// ep-square
	std::string ep_sq = "";
	if (ifo.eps != no_square) {
		ep_sq += SanCols[util::col(ifo.eps)] + std::to_string(util::row(ifo.eps) + 1);
	}
	fen += (ep_sq == "" ? " -" : " " + ep_sq);

	// move50
	std::string mv50 = std::to_string(ifo.move50);
	fen += " " + mv50;

	// half-mvs
	std::string half_mvs = std::to_string(ifo.hmvs);
	fen += " " + half_mvs;

	return fen;
}